

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osutils.cpp
# Opt level: O0

void * asmjit::OSUtils::allocVirtualMemory(size_t size,size_t *allocated,uint32_t flags)

{
  VMemInfo *pVVar1;
  ulong __len;
  uint in_EDX;
  ulong *in_RSI;
  long in_RDI;
  void *mbase;
  int protection;
  size_t alignedSize;
  VMemInfo *vmi;
  uint local_44;
  void *local_18;
  
  pVVar1 = OSUtils_GetVMemInfo();
  __len = in_RDI + (pVVar1->pageSize - 1) & (pVVar1->pageSize - 1 ^ 0xffffffffffffffff);
  local_44 = 1;
  if ((in_EDX & 1) != 0) {
    local_44 = 3;
  }
  if ((in_EDX & 2) != 0) {
    local_44 = local_44 | 4;
  }
  local_18 = mmap((void *)0x0,__len,local_44,0x22,-1,0);
  if (local_18 == (void *)0xffffffffffffffff) {
    local_18 = (void *)0x0;
  }
  else if (in_RSI != (ulong *)0x0) {
    *in_RSI = __len;
  }
  return local_18;
}

Assistant:

void* OSUtils::allocVirtualMemory(size_t size, size_t* allocated, uint32_t flags) noexcept {
  const VMemInfo& vmi = OSUtils_GetVMemInfo();

  size_t alignedSize = Utils::alignTo<size_t>(size, vmi.pageSize);
  int protection = PROT_READ;

  if (flags & kVMWritable  ) protection |= PROT_WRITE;
  if (flags & kVMExecutable) protection |= PROT_EXEC;

  void* mbase = ::mmap(nullptr, alignedSize, protection, MAP_PRIVATE | MAP_ANONYMOUS, -1, 0);
  if (ASMJIT_UNLIKELY(mbase == MAP_FAILED)) return nullptr;

  if (allocated) *allocated = alignedSize;
  return mbase;
}